

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_get_specialization_constants
          (spvc_compiler compiler,spvc_specialization_constant **constants,size_t *num_constants)

{
  spvc_specialization_constant sVar1;
  spvc_context psVar2;
  size_t sVar3;
  undefined8 uVar4;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var5;
  long lVar6;
  SmallVector<spvc_specialization_constant,_8UL> translated;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> spec_constants;
  undefined1 local_e0 [88];
  undefined1 local_88 [88];
  
  spirv_cross::Compiler::get_specialization_constants
            ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)local_88,
             (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
  local_e0._8_8_ = 0;
  local_e0._16_8_ = 8;
  local_e0._0_8_ = (spvc_specialization_constant *)(local_e0 + 0x18);
  spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::reserve
            ((SmallVector<spvc_specialization_constant,_8UL> *)local_e0,local_88._8_8_);
  uVar4 = local_88._0_8_;
  if (local_88._8_8_ != 0) {
    lVar6 = 0;
    do {
      sVar1 = *(spvc_specialization_constant *)((long)&((ConstantID *)uVar4)->id + lVar6);
      spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::reserve
                ((SmallVector<spvc_specialization_constant,_8UL> *)local_e0,local_e0._8_8_ + 1);
      *(spvc_specialization_constant *)(local_e0._0_8_ + local_e0._8_8_ * 8) = sVar1;
      local_e0._8_8_ = local_e0._8_8_ + 1;
      lVar6 = lVar6 + 8;
    } while (local_88._8_8_ << 3 != lVar6);
  }
  _Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0x60);
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined ***)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__TemporaryBuffer_0048fbc8;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 **)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
       (undefined8 *)
       ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20);
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 8;
  spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::operator=
            ((SmallVector<spvc_specialization_constant,_8UL> *)
             ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8),
             (SmallVector<spvc_specialization_constant,_8UL> *)local_e0);
  *constants = *(spvc_specialization_constant **)
                ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                8);
  *num_constants =
       *(size_t *)
        ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10);
  psVar2 = compiler->context;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&psVar2->allocations,
            (psVar2->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar3 = (psVar2->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar3]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       _Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar3 + 1;
  local_e0._8_8_ = 0;
  if ((spvc_specialization_constant *)local_e0._0_8_ !=
      (spvc_specialization_constant *)(local_e0 + 0x18)) {
    free((void *)local_e0._0_8_);
  }
  local_88._8_8_ = 0;
  if ((SpecializationConstant *)local_88._0_8_ != (SpecializationConstant *)(local_88 + 0x18)) {
    free((void *)local_88._0_8_);
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_specialization_constants(spvc_compiler compiler,
                                                       const spvc_specialization_constant **constants,
                                                       size_t *num_constants)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto spec_constants = compiler->compiler->get_specialization_constants();
		SmallVector<spvc_specialization_constant> translated;
		translated.reserve(spec_constants.size());
		for (auto &c : spec_constants)
		{
			spvc_specialization_constant trans = { c.id, c.constant_id };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_specialization_constant>>();
		ptr->buffer = std::move(translated);
		*constants = ptr->buffer.data();
		*num_constants = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}